

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_CMNO_MultipleSuccessfullJobsPass_Test::TestBody
          (InterpreterTestSuite_CMNO_MultipleSuccessfullJobsPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  bool bVar1;
  CommissionerAppMock *pCVar2;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar3;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar4;
  long lVar5;
  char *expected_predicate_value;
  char *pcVar6;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  uint8_t camIdx;
  Status local_4f1;
  allocator local_4f0;
  allocator local_4ef;
  allocator local_4ee;
  allocator local_4ed;
  allocator local_4ec;
  allocator local_4eb;
  allocator local_4ea;
  allocator local_4e9;
  AssertionResult gtest_ar;
  Expression expr;
  _Any_data local_4b8;
  long local_4a8;
  undefined8 uStack_4a0;
  undefined1 local_498 [16];
  code *local_488;
  code *pcStack_480;
  AssertionResult gtest_ar_;
  MatcherBase<const_ot::commissioner::Config_&> local_458;
  MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_438;
  undefined1 local_420 [72];
  Registry *local_3d8;
  State local_3d0;
  State local_3cc;
  CommissionerAppMockPtr commissionerAppMocks [2];
  _Any_data local_3a8;
  code *local_398;
  code *pcStack_390;
  string local_388;
  UnixTime local_368;
  UnixTime local_360;
  Value value;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  local_3d8 = ctx.mRegistry;
  std::__cxx11::string::string((string *)local_420,"127.0.0.1",&local_4e9);
  local_438._vptr_MatcherBase = (_func_int **)0x0;
  local_438.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_438.impl_.
  super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&expr,"1.1",&local_4ea);
  ot::commissioner::BorderAgent::State::State(&local_3cc,0,0,0,0,0);
  std::__cxx11::string::string((string *)&gtest_ar_,"net1",&local_4eb);
  std::__cxx11::string::string((string *)local_4b8._M_pod_data,"",&local_4ec);
  std::__cxx11::string::string((string *)local_498,"",&local_4ed);
  std::__cxx11::string::string((string *)commissionerAppMocks,"",&local_4ee);
  local_458._vptr_MatcherBase = (_func_int **)0x0;
  local_458.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_458.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)local_3a8._M_pod_data,"domain1",&local_4ef);
  pcVar6 = "";
  std::__cxx11::string::string((string *)&local_388,"",&local_4f0);
  ot::commissioner::UnixTime::UnixTime(&local_360,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&value,(string *)local_420,0x4e21,(ByteArray *)&local_438,
             (string *)&expr,local_3cc,(string *)&gtest_ar_,1,(string *)&local_4b8,
             (string *)local_498,(Timestamp)0x0,0,(string *)commissionerAppMocks,
             (ByteArray *)&local_458,(string *)&local_3a8,'\0',0,&local_388,local_360,0x103f);
  camIdx = ot::commissioner::persistent_storage::Registry::Add(local_3d8,(BorderAgent *)&value);
  local_4f1 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&camIdx,&local_4f1);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)local_3a8._M_pod_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458);
  std::__cxx11::string::~string((string *)commissionerAppMocks);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::~string((string *)local_4b8._M_pod_data);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&expr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_438);
  std::__cxx11::string::~string((string *)local_420);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_420,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x305,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_420,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_420);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_3d8 = ctx.mRegistry;
    std::__cxx11::string::string((string *)local_420,"127.0.0.2",&local_4e9);
    local_438._vptr_MatcherBase = (_func_int **)0x0;
    local_438.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_438.impl_.
    super___shared_ptr<const_testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)&expr,"1.1",&local_4ea);
    ot::commissioner::BorderAgent::State::State(&local_3d0,0,0,0,0,0);
    std::__cxx11::string::string((string *)&gtest_ar_,"net2",&local_4eb);
    std::__cxx11::string::string((string *)local_4b8._M_pod_data,"",&local_4ec);
    std::__cxx11::string::string((string *)local_498,"",&local_4ed);
    std::__cxx11::string::string((string *)commissionerAppMocks,"",&local_4ee);
    local_458._vptr_MatcherBase = (_func_int **)0x0;
    local_458.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_458.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)local_3a8._M_pod_data,"domain2",&local_4ef);
    pcVar6 = "";
    std::__cxx11::string::string((string *)&local_388,"",&local_4f0);
    ot::commissioner::UnixTime::UnixTime(&local_368,0);
    expected_predicate_value = (char *)(ulong)(uint)local_3d0;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)local_420,0x4e21,(ByteArray *)&local_438,
               (string *)&expr,local_3d0,(string *)&gtest_ar_,2,(string *)&local_4b8,
               (string *)local_498,(Timestamp)0x0,0,(string *)commissionerAppMocks,
               (ByteArray *)&local_458,(string *)&local_3a8,'\0',0,&local_388,local_368,0x103f);
    camIdx = ot::commissioner::persistent_storage::Registry::Add(local_3d8,(BorderAgent *)&value);
    local_4f1 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&camIdx,&local_4f1);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)local_3a8._M_pod_data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458);
    std::__cxx11::string::~string((string *)commissionerAppMocks);
    std::__cxx11::string::~string((string *)local_498);
    std::__cxx11::string::~string((string *)local_4b8._M_pod_data);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_438);
    std::__cxx11::string::~string((string *)local_420);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      camIdx = '\0';
      pCVar2 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar2,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar2);
      std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<CommissionerAppMock,void>
                ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                 commissionerAppMocks,pCVar2);
      pCVar2 = (CommissionerAppMock *)operator_new(0x1838);
      memset(pCVar2,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(pCVar2);
      std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<CommissionerAppMock,void>
                ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                 (commissionerAppMocks + 1),pCVar2);
      testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
      testing::A<ot::commissioner::Config_const&>();
      CommissionerAppStaticExpecter::gmock_Create
                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)local_420,&ctx.mCommissionerAppStaticExpecter,
                 (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_438,
                 (Matcher<const_ot::commissioner::Config_&> *)&local_458);
      testing::internal::GetWithoutMatchers();
      pTVar3 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                           *)local_420,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x30f,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      pTVar3 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               ::Times(pTVar3,2);
      local_188._0_4_ = kNone;
      local_180._M_p = (pointer)&local_170;
      local_178 = 0;
      local_170._M_local_buf[0] = '\0';
      testing::Return<ot::commissioner::Error>((testing *)&gtest_ar,(Error *)local_188);
      std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)&local_388,
                 (__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      gtest_ar_._0_8_ =
           (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)commissionerAppMocks;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )&camIdx;
      local_388.field_2._M_allocated_capacity =
           (size_type)
           (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)commissionerAppMocks;
      local_388.field_2._8_8_ = &camIdx;
      std::_Function_base::~_Function_base((_Function_base *)&expr);
      std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)&local_4b8
                 ,(function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                  &gtest_ar_);
      local_488 = (code *)0x0;
      pcStack_480 = (code *)0x0;
      local_498._0_8_ = (pointer)0x0;
      local_498._8_8_ = 0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498._0_8_ = operator_new(0x20);
      *(undefined8 *)local_498._0_8_ = 0;
      *(undefined8 *)(local_498._0_8_ + 8) = 0;
      *(undefined8 *)(local_498._0_8_ + 0x10) = 0;
      *(undefined8 *)(local_498._0_8_ + 0x18) = uStack_4a0;
      if (local_4a8 != 0) {
        *(void **)local_498._0_8_ = local_4b8._M_unused._M_object;
        *(undefined8 *)(local_498._0_8_ + 8) = local_4b8._8_8_;
        *(long *)(local_498._0_8_ + 0x10) = local_4a8;
        local_4a8 = 0;
        uStack_4a0 = 0;
      }
      local_498._8_8_ =
           expr.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_488 = std::_Function_handler::operator_cast_to_Action;
      pcStack_480 = std::_Function_handler::operator_cast_to_Action;
      std::_Function_base::~_Function_base((_Function_base *)&expr);
      std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
      std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
      __l._M_len = 1;
      __l._M_array = (iterator)local_498;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                *)&value,__l,(allocator_type *)&expr);
      std::_Function_base::~_Function_base((_Function_base *)local_498);
      __return_storage_ptr__ = &value.mError.mMessage.field_2;
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)__return_storage_ptr__,(ReturnAction *)&local_388);
      local_398 = (code *)0x0;
      pcStack_390 = (code *)0x0;
      local_3a8._M_unused._M_object = (void *)0x0;
      local_3a8._8_8_ = 0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a8._M_unused._M_object = operator_new(0x38);
      *(undefined8 *)local_3a8._M_unused._0_8_ = value.mError._0_8_;
      *(pointer *)((long)local_3a8._M_unused._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
      *(size_type *)((long)local_3a8._M_unused._0_8_ + 0x10) =
           value.mError.mMessage._M_string_length;
      value.mError.mCode = kNone;
      value.mError._4_4_ = 0;
      value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
      value.mError.mMessage._M_string_length = 0;
      *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x18) = 0;
      *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x20) = 0;
      *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x28) = 0;
      *(size_type *)((long)local_3a8._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
      if (value.mData._M_dataplus._M_p != (pointer)0x0) {
        *(ulong *)((long)local_3a8._M_unused._0_8_ + 0x18) =
             CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                      value.mError.mMessage.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_3a8._M_unused._0_8_ + 0x20) =
             value.mError.mMessage.field_2._8_8_;
        *(pointer *)((long)local_3a8._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
        value.mData._M_dataplus._M_p = (pointer)0x0;
        value.mData._M_string_length = 0;
      }
      local_3a8._8_8_ =
           expr.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398 = std::_Function_handler::operator_cast_to_Action;
      pcStack_390 = std::_Function_handler::operator_cast_to_Action;
      std::_Function_base::~_Function_base((_Function_base *)&expr);
      anon_func::Op::~Op((Op *)&value);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillRepeatedly(pTVar3,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                               *)&local_3a8);
      std::_Function_base::~_Function_base((_Function_base *)&local_3a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_388._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
      std::__cxx11::string::~string((string *)&local_180);
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                      *)(local_420 + 8));
      testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase(&local_458);
      testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
      ~MatcherBase(&local_438);
      testing::A<std::__cxx11::string&>();
      testing::A<std::__cxx11::string_const&>();
      testing::A<unsigned_short>();
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)&value,
                 commissionerAppMocks[0].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&expr,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&gtest_ar_,(Matcher<unsigned_short> *)&local_4b8);
      testing::internal::GetWithoutMatchers();
      pTVar4 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                           *)&value,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x314,"*commissionerAppMocks[0]","Start(_, _, _)");
      pTVar4 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar4,1);
      local_1b0._0_4_ = kNone;
      local_1a8._M_p = (pointer)&local_198;
      local_1a0 = 0;
      local_198._M_local_buf[0] = '\0';
      testing::Return<ot::commissioner::Error>((testing *)local_498,(Error *)local_1b0);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_420,(ReturnAction *)local_498);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(pTVar4,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         *)local_420);
      std::_Function_base::~_Function_base((_Function_base *)local_420);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                      *)&value.mError.mMessage);
      testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                ((MatcherBase<unsigned_short> *)&local_4b8);
      testing::internal::
      MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_ar_);
      testing::internal::
      MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&expr);
      testing::A<std::__cxx11::string&>();
      testing::A<std::__cxx11::string_const&>();
      testing::A<unsigned_short>();
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)&value,
                 commissionerAppMocks[1].
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&expr,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&gtest_ar_,(Matcher<unsigned_short> *)&local_4b8);
      testing::internal::GetWithoutMatchers();
      pTVar4 = testing::internal::
               MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::InternalExpectedAt
                         ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                           *)&value,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x315,"*commissionerAppMocks[1]","Start(_, _, _)");
      pTVar4 = testing::internal::
               TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
               ::Times(pTVar4,1);
      local_1d8._0_4_ = kNone;
      local_1d0._M_p = (pointer)&local_1c0;
      local_1c8 = 0;
      local_1c0._M_local_buf[0] = '\0';
      testing::Return<ot::commissioner::Error>((testing *)local_498,(Error *)local_1d8);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_420,(ReturnAction *)local_498);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(pTVar4,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         *)local_420);
      std::_Function_base::~_Function_base((_Function_base *)local_420);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_498 + 8));
      std::__cxx11::string::~string((string *)&local_1d0);
      std::
      _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                      *)&value.mError.mMessage);
      testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                ((MatcherBase<unsigned_short> *)&local_4b8);
      testing::internal::
      MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_ar_);
      testing::internal::
      MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&expr);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mMessage.field_2._M_local_buf[0] = '\0';
      value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
      value.mData._M_string_length = 0;
      value.mData.field_2._M_local_buf[0] = '\0';
      value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      std::__cxx11::string::string
                ((string *)local_420,"start --nwk net1 net2",(allocator *)local_4b8._M_pod_data);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_420);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_420);
      ot::commissioner::Interpreter::Eval((Value *)local_420,&ctx.mInterpreter,&expr);
      ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_420);
      ot::commissioner::Interpreter::Value::~Value((Value *)local_420);
      bVar1 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.success_ = bVar1;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_4b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_420,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_498,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x31b,(char *)local_420._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_498,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
        std::__cxx11::string::~string((string *)local_420);
        if ((long *)local_4b8._M_unused._0_8_ != (long *)0x0) {
          (**(code **)(*local_4b8._M_unused._M_object + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ot::commissioner::Interpreter::Value::~Value(&value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expr);
      lVar5 = 0x18;
      do {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&commissionerAppMocks[0].
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != -8);
      goto LAB_0014b90d;
    }
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_420,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x30a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_420,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_420);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_0014b90d:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, CMNO_MultipleSuccessfullJobsPass)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[2] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(2)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1 net2");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}